

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix3f.cpp
# Opt level: O0

Matrix3f * Matrix3f::rotateX(float radians)

{
  Matrix3f *in_RDI;
  float in_XMM0_Da;
  double dVar1;
  double dVar2;
  float s;
  float c;
  
  dVar1 = cos((double)in_XMM0_Da);
  dVar2 = sin((double)in_XMM0_Da);
  Matrix3f(in_RDI,1.0,0.0,0.0,0.0,(float)dVar1,-(float)dVar2,0.0,(float)dVar2,(float)dVar1);
  return in_RDI;
}

Assistant:

Matrix3f Matrix3f::rotateX( float radians )
{
	float c = cos( radians );
	float s = sin( radians );

	return Matrix3f
	(
		1, 0, 0,
		0, c, -s,
		0, s, c
	);
}